

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# persistence.h
# Opt level: O2

tuple<unsigned_long,_unsigned_long,_int> * __thiscall
greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t_&>
::get_coboundary_size_and_gap_and_pivot
          (tuple<unsigned_long,_unsigned_long,_int> *__return_storage_ptr__,
          greater_filtration_or_better_pivot_or_smaller_index<filtration_index_t,_directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t_&>
          *this,filtration_entry_t a)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  filtration_entry_t fVar4;
  int iVar5;
  unsigned_long uVar6;
  int iVar7;
  unsigned_long uVar8;
  coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  iterator;
  coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
  local_50;
  
  directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t::coboundary
            (&local_50,this->complex,a);
  uVar6 = 0;
  uVar8 = 0;
  iVar7 = 0;
  while (bVar2 = directed_flag_complex_in_memory_computer::
                 coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
                 ::has_next(&local_50), bVar2) {
    uVar6 = uVar6 + 1;
    fVar4 = directed_flag_complex_in_memory_computer::
            coboundary_iterator_t<directed_flag_complex_in_memory_computer::directed_flag_complex_in_memory_computer_t>
            ::next(&local_50);
    iVar3 = fVar4.super_pair<float,_int>.second;
    iVar5 = iVar7 - iVar3;
    iVar1 = iVar3;
    if (iVar5 != 0 && iVar3 <= iVar7) {
      iVar1 = iVar7;
    }
    bVar2 = iVar7 < iVar3;
    iVar7 = iVar1;
    if (bVar2) {
      uVar8 = (long)-iVar5;
    }
  }
  (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
  super__Tuple_impl<1UL,_unsigned_long,_int>.super__Tuple_impl<2UL,_int>.
  super__Head_base<2UL,_int,_false>._M_head_impl = iVar7;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
  super__Tuple_impl<1UL,_unsigned_long,_int>.super__Head_base<1UL,_unsigned_long,_false>.
  _M_head_impl = uVar8;
  (__return_storage_ptr__->super__Tuple_impl<0UL,_unsigned_long,_unsigned_long,_int>).
  super__Head_base<0UL,_unsigned_long,_false>._M_head_impl = uVar6;
  return __return_storage_ptr__;
}

Assistant:

std::tuple<size_t, size_t, index_t> get_coboundary_size_and_gap_and_pivot(filtration_entry_t a) const {
		// Look at the first two gaps of the pivot and the next element
		index_t pivot = 0;
		size_t gap_after_pivot = 0;
		auto iterator = complex.coboundary(a);
		size_t coboundary_size = 0;
		while (iterator.has_next()) {
			coboundary_size++;
			index_t next_index = get_index(iterator.next().second);
			if (next_index > pivot) {
				gap_after_pivot = next_index - pivot;
				pivot = next_index;
			}
		}

		return std::make_tuple(coboundary_size, gap_after_pivot, pivot);
	}